

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O3

void * hash_scan(hash *hash,hash_check_func *check_func,void *ctx)

{
  avl_node *node;
  avl_node *paVar1;
  void *pvVar2;
  ulong uVar3;
  
  if (hash->nbuckets == 0) {
    return (void *)0x0;
  }
  uVar3 = 0;
  do {
    node = avl_first(hash->buckets + uVar3);
    while (node != (avl_node *)0x0) {
      paVar1 = avl_next(node);
      pvVar2 = (*check_func)((hash_elem *)node,ctx);
      node = paVar1;
      if (pvVar2 != (void *)0x0) {
        return pvVar2;
      }
    }
    uVar3 = uVar3 + 1;
  } while (uVar3 < hash->nbuckets);
  return (void *)0x0;
}

Assistant:

void *hash_scan(struct hash *hash, hash_check_func *check_func, void *ctx)
{
    size_t i;
    void *ret = NULL;

#ifdef _HASH_TREE
    struct avl_node *node;
#else
    struct list_elem *e;
#endif

    struct hash_elem *h;

    for (i=0;i<hash->nbuckets;++i){
#ifdef _HASH_TREE
        node = avl_first(hash->buckets + i);
        while(node){
            h = _get_entry(node, struct hash_elem, avl);
            node = avl_next(node);
            ret = check_func(h, ctx);
            if (ret) {
                return ret;
            }
        }

#else
        e = list_begin(hash->buckets + i);
        while(e) {
            h = _get_entry(e, struct hash_elem, list_elem);
            ret = check_func(h, ctx);
            if (ret) {
                return ret;
            }
            e = list_next(e);
        }

#endif
    }
    return ret;
}